

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O3

void __thiscall UIContext::Detail::Render(Detail *this,ApplicationContextBase *context)

{
  ImVec2 IVar1;
  ImGuiIO *pIVar2;
  ImDrawData *draw_data;
  int h;
  int w;
  char buff [256];
  int local_148;
  int local_144;
  ImVec2 local_140;
  ImVec2 local_138 [33];
  
  if ((this->_window != (GLFWwindow *)0x0) && (context->join_now == false)) {
    glfwMakeContextCurrent(this->_window);
    ActivateContext(this);
    glfwGetFramebufferSize(this->_window,&local_144,&local_148);
    pIVar2 = ImGui::GetIO();
    IVar1.y = (float)local_148;
    IVar1.x = (float)local_144;
    pIVar2->DisplaySize = IVar1;
    ImGui_ImplOpenGL3_NewFrame();
    ImGui_ImplGlfw_NewFrame();
    ImGui::NewFrame();
    local_138[0].x = 0.0;
    local_138[0].y = 0.0;
    local_140.x = 0.0;
    local_140.y = 0.0;
    ImGui::SetNextWindowPos(local_138,0,&local_140);
    local_138[0].y = (float)local_148;
    local_138[0].x = (float)local_144;
    ImGui::SetNextWindowSize(local_138,0);
    sprintf((char *)local_138,"###GraphicsWindow_%td",this);
    ImGui::Begin((char *)local_138,(bool *)0x0,0x303f);
    ImGui::SetWindowFontScale(2.0);
    glViewport(0,0,local_144,local_148);
    glClearColor(0x3b808081,0,0,0x3b808081);
    glClear(0x4100);
    if ((this->_run).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->_run)._M_invoker)((_Any_data *)&this->_run,context);
    }
    ImGui::End();
    ImGui::Render();
    draw_data = ImGui::GetDrawData();
    ImGui_ImplOpenGL3_RenderDrawData(draw_data);
    glfwSwapBuffers(this->_window);
  }
  return;
}

Assistant:

void Render(ApplicationContextBase& context)
    {
        if (!_window || context.join_now)
            return;

        glfwMakeContextCurrent(_window);

        ActivateContext();

        int w, h;
        glfwGetFramebufferSize(_window, &w, &h);

        auto& io = ImGui::GetIO();
        // Setup display size (every frame to accommodate for window resizing)
        io.DisplaySize = ImVec2(static_cast<float>(w), static_cast<float>(h));

        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplGlfw_NewFrame();
        ImGui::NewFrame();

        //ImGuizmo::BeginFrame();

        // make a full screen window
        ImGui::SetNextWindowPos(ImVec2(0, 0));
        ImGui::SetNextWindowSize(ImVec2(static_cast<float>(w), static_cast<float>(h)));
        ImGuiWindowFlags flags =
            ImGuiWindowFlags_NoTitleBar
            | ImGuiWindowFlags_NoResize
            | ImGuiWindowFlags_NoMove
            | ImGuiWindowFlags_NoCollapse
            | ImGuiWindowFlags_NoBringToFrontOnFocus
            | ImGuiWindowFlags_NoFocusOnAppearing
            | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;

        // ensure every window has a unique id
        char buff[256];
        sprintf(buff, "###GraphicsWindow_%td", (ptrdiff_t)this);
        ImGui::Begin(buff, 0, flags);

        const float font_scale = 2.0f;
        ImGui::SetWindowFontScale(font_scale);

        // Rendering
        glViewport(0, 0, w, h);

        ImVec4 clear_color = ImColor(1, 0, 0, 1);

        glClearColor(clear_color.x, clear_color.y, clear_color.z, clear_color.w);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

        if (_run) _run(context);

        ImGui::End(); // end the main window
        ImGui::Render();
        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());

        glfwSwapBuffers(_window);
    }